

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lp_solver.cc
# Opt level: O0

Int __thiscall ipx::LpSolver::GetBasis(LpSolver *this,Int *cbasis,Int *vbasis)

{
  bool bVar1;
  vector<int,_std::allocator<int>_> *in_RDI;
  Basis *in_stack_00000018;
  Int *in_stack_00000060;
  vector<int,_std::allocator<int>_> *in_stack_00000068;
  Model *in_stack_00000070;
  Int local_4;
  
  bVar1 = std::unique_ptr::operator_cast_to_bool
                    ((unique_ptr<ipx::Basis,_std::default_delete<ipx::Basis>_> *)0x839bc9);
  if (bVar1) {
    bVar1 = std::vector<int,_std::allocator<int>_>::empty(in_RDI);
    if (bVar1) {
      std::unique_ptr<ipx::Basis,_std::default_delete<ipx::Basis>_>::operator*
                ((unique_ptr<ipx::Basis,_std::default_delete<ipx::Basis>_> *)
                 &in_RDI[0x51].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage);
      BuildBasicStatuses(in_stack_00000018);
      Model::PostsolveBasis(in_stack_00000070,in_stack_00000068,in_stack_00000060,(Int *)this);
      std::vector<int,_std::allocator<int>_>::~vector(in_RDI);
    }
    else {
      Model::PostsolveBasis(in_stack_00000070,in_stack_00000068,in_stack_00000060,(Int *)this);
    }
    local_4 = 0;
  }
  else {
    local_4 = -1;
  }
  return local_4;
}

Assistant:

Int LpSolver::GetBasis(Int* cbasis, Int* vbasis) {
    if (!basis_)
        return -1;
    if (!basic_statuses_.empty()) {
        // crossover provides basic statuses
        model_.PostsolveBasis(basic_statuses_, cbasis, vbasis);
    } else {
        model_.PostsolveBasis(BuildBasicStatuses(*basis_), cbasis, vbasis);
    }
    return 0;
}